

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

Clu_Man_t *
Fra_ClausAlloc(Aig_Man_t *pAig,int nFrames,int nPref,int nClausesMax,int nLutSize,int nLevels,
              int nCutsMax,int nBatches,int fStepUp,int fTarget,int fVerbose,int fVeryVerbose)

{
  ulong uVar1;
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  int i;
  Clu_Man_t *pCVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  
  pCVar4 = (Clu_Man_t *)calloc(1,0xb8);
  pCVar4->pAig = pAig;
  pCVar4->nFrames = nFrames;
  pCVar4->nPref = nPref;
  pCVar4->nClausesMax = nClausesMax;
  pCVar4->nLutSize = nLutSize;
  pCVar4->nLevels = nLevels;
  pCVar4->nCutsMax = nCutsMax;
  pCVar4->nBatches = nBatches;
  pCVar4->fStepUp = fStepUp;
  pCVar4->fTarget = fTarget;
  pCVar4->fVerbose = fVerbose;
  pCVar4->fVeryVerbose = fVeryVerbose;
  pCVar4->nSimWords = 0x200;
  pCVar4->nSimFrames = 0x20;
  pCVar4->nSimWordsPref = nPref << 4;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x4000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x10000);
  pVVar5->pArray = piVar6;
  pCVar4->vLits = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x4000);
  pVVar5->pArray = piVar6;
  pCVar4->vClauses = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x4000);
  pVVar5->pArray = piVar6;
  pCVar4->vCosts = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x4000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x10000);
  pVVar5->pArray = piVar6;
  pCVar4->vLitsProven = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x4000);
  pVVar5->pArray = piVar6;
  pCVar4->vClausesProven = pVVar5;
  pCVar4->nCexesAlloc = 0x400;
  lVar11 = (long)pAig->vObjs->nSize;
  uVar1 = lVar11 + 1;
  ppvVar7 = (void **)malloc(uVar1 * 0x80 + lVar11 * 8 + 8);
  auVar3 = _DAT_008403e0;
  iVar12 = (int)uVar1;
  if (lVar11 < 0) {
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    pVVar8->nSize = iVar12;
    pVVar8->nCap = iVar12;
    pVVar8->pArray = ppvVar7;
    pCVar4->vCexes = pVVar8;
  }
  else {
    lVar10 = (uVar1 & 0xffffffff) - 1;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar13 = auVar13 ^ _DAT_008403e0;
    auVar14 = _DAT_008403d0;
    do {
      auVar15 = auVar14 ^ auVar3;
      lVar16 = auVar14._8_8_;
      if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                  auVar13._4_4_ < auVar15._4_4_) & 1)) {
        *(void ***)((long)ppvVar7 + lVar10) = ppvVar7 + lVar11 + auVar14._0_8_ * 0x10 + 1;
      }
      if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
          auVar15._12_4_ <= auVar13._12_4_) {
        *(void ***)((long)ppvVar7 + lVar10 + 8) = ppvVar7 + lVar11 + lVar16 * 0x10 + 1;
      }
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar16 + 2;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(iVar12 + 1U >> 1) << 4 != lVar10);
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    pVVar8->nSize = iVar12;
    pVVar8->nCap = iVar12;
    pVVar8->pArray = ppvVar7;
    pCVar4->vCexes = pVVar8;
    uVar9 = 0;
    do {
      pauVar2 = (undefined1 (*) [16])ppvVar7[uVar9];
      pauVar2[7] = (undefined1  [16])0x0;
      pauVar2[6] = (undefined1  [16])0x0;
      pauVar2[5] = (undefined1  [16])0x0;
      pauVar2[4] = (undefined1  [16])0x0;
      pauVar2[3] = (undefined1  [16])0x0;
      pauVar2[2] = (undefined1  [16])0x0;
      pauVar2[1] = (undefined1  [16])0x0;
      *pauVar2 = (undefined1  [16])0x0;
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  return pCVar4;
}

Assistant:

Clu_Man_t * Fra_ClausAlloc( Aig_Man_t * pAig, int nFrames, int nPref, int nClausesMax, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fTarget, int fVerbose, int fVeryVerbose )
{
    Clu_Man_t * p;
    p = ABC_ALLOC( Clu_Man_t, 1 );
    memset( p, 0, sizeof(Clu_Man_t) );
    p->pAig          = pAig;
    p->nFrames       = nFrames;
    p->nPref         = nPref;
    p->nClausesMax   = nClausesMax;
    p->nLutSize      = nLutSize;
    p->nLevels       = nLevels;
    p->nCutsMax      = nCutsMax;
    p->nBatches      = nBatches;
    p->fStepUp       = fStepUp;
    p->fTarget       = fTarget;
    p->fVerbose      = fVerbose;
    p->fVeryVerbose  = fVeryVerbose;
    p->nSimWords     = 512;//1024;//64;
    p->nSimFrames    = 32;//8;//32;
    p->nSimWordsPref = p->nPref*p->nSimWords/p->nSimFrames;

    p->vLits         = Vec_IntAlloc( 1<<14 );
    p->vClauses      = Vec_IntAlloc( 1<<12 );
    p->vCosts        = Vec_IntAlloc( 1<<12 );

    p->vLitsProven   = Vec_IntAlloc( 1<<14 );
    p->vClausesProven= Vec_IntAlloc( 1<<12 );

    p->nCexesAlloc   = 1024;
    p->vCexes        = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p->pAig)+1, p->nCexesAlloc/32 );
    Vec_PtrCleanSimInfo( p->vCexes, 0, p->nCexesAlloc/32 );
    return p;
}